

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O1

int bin_mdef_phone_id_nearest(bin_mdef_t *m,int32 b,int32 l,int32 r,int32 pos)

{
  int rc;
  bool bVar1;
  int iVar2;
  int iVar3;
  int wpos;
  
  if ((r | l) < 0) {
    return b;
  }
  iVar2 = bin_mdef_phone_id(m,b,l,r,pos);
  if (-1 < iVar2) {
    return iVar2;
  }
  iVar2 = 0;
  do {
    if ((pos != iVar2) && (iVar3 = bin_mdef_phone_id(m,b,l,r,iVar2), -1 < iVar3)) {
      return iVar3;
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  iVar2 = m->sil;
  if (iVar2 < 0) {
    return b;
  }
  iVar3 = l;
  if (m->phone[(uint)l].info.ci.filler != '\0') {
    iVar3 = iVar2;
  }
  if ((pos & 0xfffffffdU) == 1) {
    iVar3 = iVar2;
  }
  rc = r;
  if (m->phone[(uint)r].info.ci.filler != '\0') {
    rc = iVar2;
  }
  if ((pos & 0xfffffffeU) == 2) {
    rc = iVar2;
  }
  if ((iVar3 != l) || (rc != r)) {
    iVar2 = bin_mdef_phone_id(m,b,iVar3,rc,pos);
    wpos = 0;
    if (-1 < iVar2) {
LAB_001219d3:
      bVar1 = false;
      goto LAB_001219d5;
    }
    do {
      if ((pos != wpos) && (iVar2 = bin_mdef_phone_id(m,b,iVar3,rc,wpos), -1 < iVar2))
      goto LAB_001219d3;
      wpos = wpos + 1;
    } while (wpos != 4);
  }
  bVar1 = true;
LAB_001219d5:
  if (bVar1) {
    return b;
  }
  return iVar2;
}

Assistant:

int
bin_mdef_phone_id_nearest(bin_mdef_t * m, int32 b, int32 l, int32 r, int32 pos)
{
    int p, tmppos;



    /* In the future, we might back off when context is not available,
     * but for now we'll just return the CI phone. */
    if (l < 0 || r < 0)
        return b;

    p = bin_mdef_phone_id(m, b, l, r, pos);
    if (p >= 0)
        return p;

    /* Exact triphone not found; backoff to other word positions */
    for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
        if (tmppos != pos) {
            p = bin_mdef_phone_id(m, b, l, r, tmppos);
            if (p >= 0)
                return p;
        }
    }

    /* Nothing yet; backoff to silence phone if non-silence filler context */
    /* In addition, backoff to silence phone on left/right if in beginning/end position */
    if (m->sil >= 0) {
        int newl = l, newr = r;
        if (m->phone[(int)l].info.ci.filler
            || pos == WORD_POSN_BEGIN || pos == WORD_POSN_SINGLE)
            newl = m->sil;
        if (m->phone[(int)r].info.ci.filler
            || pos == WORD_POSN_END || pos == WORD_POSN_SINGLE)
            newr = m->sil;
        if ((newl != l) || (newr != r)) {
            p = bin_mdef_phone_id(m, b, newl, newr, pos);
            if (p >= 0)
                return p;

            for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
                if (tmppos != pos) {
                    p = bin_mdef_phone_id(m, b, newl, newr, tmppos);
                    if (p >= 0)
                        return p;
                }
            }
        }
    }

    /* Nothing yet; backoff to base phone */
    return b;
}